

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O1

int kwsysSystem_Shell__ArgumentNeedsQuotes(char *in,int isUnix,int flags)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte *c;
  uint uVar4;
  int iVar5;
  
  bVar2 = *in;
  iVar5 = 1;
  if (bVar2 != 0) {
    if (*in != '\0') {
      c = (byte *)in;
      do {
        if (((flags & 0x40U) != 0) &&
           (c = (byte *)kwsysSystem_Shell__SkipMakeVariables((char *)c), *c == 0)) break;
        if ((flags & 4U) == 0 || isUnix != 0) {
          bVar3 = *c;
          if (bVar3 == 9) {
            return 1;
          }
          if (bVar3 == 0x20) {
            return 1;
          }
          uVar4 = bVar3 - 0x23;
          if (isUnix == 0) {
            if ((uVar4 < 0x3c) && ((0x80000000a000019U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
              return 1;
            }
            if (bVar3 == 0x7c) {
              return 1;
            }
          }
          else {
            if ((uVar4 < 0x3e) && ((0x2a0000000b0000fbU >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
              return 1;
            }
            if (bVar3 == 0x7c) {
              return 1;
            }
            if (bVar3 == 0x7e) {
              return 1;
            }
          }
        }
        pbVar1 = c + 1;
        c = c + 1;
      } while (*pbVar1 != 0);
    }
    if (((isUnix != 0) || (in[1] != '\0')) ||
       (((0x3b < bVar2 - 0x23 || ((0x800000010000009U >> ((ulong)(bVar2 - 0x23) & 0x3f) & 1) == 0))
        && (bVar2 != 0x7c)))) {
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

static int kwsysSystem_Shell__ArgumentNeedsQuotes(const char* in, int isUnix,
                                                  int flags)
{
  /* The empty string needs quotes.  */
  if(!*in)
    {
    return 1;
    }

  /* Scan the string for characters that require quoting.  */
  {
  const char* c;
  for(c=in; *c; ++c)
    {
    /* Look for $(MAKEVAR) syntax if requested.  */
    if(flags & kwsysSystem_Shell_Flag_AllowMakeVariables)
      {
#if KWSYS_SYSTEM_SHELL_QUOTE_MAKE_VARIABLES
      const char* skip = kwsysSystem_Shell__SkipMakeVariables(c);
      if(skip != c)
        {
        /* We need to quote make variable references to preserve the
           string with contents substituted in its place.  */
        return 1;
        }
#else
      /* Skip over the make variable references if any are present.  */
      c = kwsysSystem_Shell__SkipMakeVariables(c);

      /* Stop if we have reached the end of the string.  */
      if(!*c)
        {
        break;
        }
#endif
      }

    /* Check whether this character needs quotes.  */
    if(kwsysSystem_Shell__CharNeedsQuotes(*c, isUnix, flags))
      {
      return 1;
      }
    }
  }

  /* On Windows some single character arguments need quotes.  */
  if(!isUnix && *in && !*(in+1))
    {
    char c = *in;
    if((c == '?') || (c == '&') || (c == '^') || (c == '|') || (c == '#'))
      {
      return 1;
      }
    }

  return 0;
}